

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall asmjit::BaseBuilder::registerLabelNode(BaseBuilder *this,LabelNode *node)

{
  uint uVar1;
  Error EVar2;
  BaseNode *in_RAX;
  BaseNode *pBVar3;
  uint n;
  undefined4 extraout_EDX;
  LabelNode *allocator;
  CodeHolder *this_00;
  CodeHolder *unaff_R15;
  LabelEntry *le;
  size_t sStack_50;
  LabelNode *pLStack_48;
  BaseBuilder *pBStack_40;
  CodeHolder *pCStack_38;
  undefined8 local_28;
  
  allocator = (LabelNode *)&stack0xffffffffffffffd8;
  this_00 = (this->super_BaseEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    return 5;
  }
  local_28 = in_RAX;
  EVar2 = CodeHolder::newLabelEntry(this_00,(LabelEntry **)&stack0xffffffffffffffd8);
  if (EVar2 != 0) {
    return EVar2;
  }
  uVar1 = *(uint *)((long)&((BaseNode *)local_28)->field_0 + 0xc);
  n = uVar1 + 1;
  if ((this->_labelNodes).super_ZoneVectorBase._size < n) {
    unaff_R15 = (CodeHolder *)&this->_labelNodes;
    allocator = (LabelNode *)&this->_allocator;
    this_00 = unaff_R15;
    EVar2 = ZoneVectorBase::_resize((ZoneVectorBase *)unaff_R15,(ZoneAllocator *)allocator,8,n);
    if (EVar2 != 0) {
      return EVar2;
    }
    if (uVar1 < (this->_labelNodes).super_ZoneVectorBase._size) {
      *(LabelNode **)
       ((long)(((ZoneVector<asmjit::LabelNode_*> *)unaff_R15)->super_ZoneVectorBase)._data +
       (ulong)uVar1 * 8) = node;
      node->_labelId = uVar1;
      return 0;
    }
  }
  else {
    registerLabelNode();
  }
  registerLabelNode();
  (allocator->super_BaseNode).field_0.field_0._prev = (BaseNode *)0x0;
  pLStack_48 = node;
  pBStack_40 = this;
  pCStack_38 = unaff_R15;
  if ((this_00->_sections).super_ZoneVectorBase._data == (void *)0x0) {
    _newAlignNode();
  }
  else {
    pBVar3 = (BaseNode *)ZoneAllocator::_alloc((ZoneAllocator *)&this_00->_sections,0x38,&sStack_50)
    ;
    node = allocator;
    unaff_R15 = this_00;
    if (pBVar3 != (BaseNode *)0x0) {
      (pBVar3->field_0).field_0._prev = (BaseNode *)0x0;
      (pBVar3->field_0).field_0._next = (BaseNode *)0x0;
      (pBVar3->field_1)._any._nodeType = '\x04';
      (pBVar3->field_1)._any._nodeFlags = *(byte *)&this_00[1]._zone._end | 0x11;
      *(undefined8 *)((long)&pBVar3->field_1 + 2) = 0;
      *(undefined8 *)((long)&pBVar3->field_3 + 2) = 0;
      pBVar3->_passData = (void *)0x0;
      pBVar3->_inlineComment = (char *)0x0;
      *(undefined4 *)&pBVar3[1].field_0 = extraout_EDX;
      *(uint *)((long)&pBVar3[1].field_0 + 4) = n;
      (allocator->super_BaseNode).field_0._links[0] = pBVar3;
      return 0;
    }
  }
  (node->super_BaseNode).field_0.field_0._prev = (BaseNode *)0x0;
  EVar2 = BaseEmitter::reportError((BaseEmitter *)unaff_R15,1,(char *)0x0);
  return EVar2;
}

Assistant:

Error BaseBuilder::registerLabelNode(LabelNode* node) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  LabelEntry* le;
  ASMJIT_PROPAGATE(_code->newLabelEntry(&le));
  uint32_t labelId = le->id();

  // We just added one label so it must be true.
  ASMJIT_ASSERT(_labelNodes.size() < labelId + 1);
  ASMJIT_PROPAGATE(_labelNodes.resize(&_allocator, labelId + 1));

  _labelNodes[labelId] = node;
  node->_labelId = labelId;

  return kErrorOk;
}